

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::
OP_ProfiledLdObjSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  Var value_00;
  FunctionBody *functionBody;
  Var value;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  Var instance_local;
  InterpreterStackFrame *this_local;
  
  value_00 = OP_LdObjSlot(this,instance,
                          (uint)(playout->
                                super_OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                                ).SlotIndex);
  functionBody = GetFunctionBody(this);
  ProfilingHelpers::ProfileLdSlot(value_00,functionBody,playout->profileId);
  return value_00;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledLdObjSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdObjSlot(instance, playout->SlotIndex);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }